

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_double(json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
               *this,double value,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  structure_type sVar1;
  semantic_tag local_29;
  double local_28;
  anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_20;
  
  sVar1 = (this->structure_stack_).
          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type_;
  local_29 = tag;
  local_28 = value;
  if (sVar1 - array_t < 2) {
    local_20._0_8_ = this->index_;
    this->index_ = local_20._0_8_ + 1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::emplace_back<std::__cxx11::wstring,unsigned_long,double&,jsoncons::semantic_tag&>
              ((vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)&this->item_stack_,&this->name_,(unsigned_long *)&local_20,&local_28,&local_29);
  }
  else if (sVar1 == root_t) {
    local_20.common_.tag_ = tag;
    local_20.json_const_pointer_ = (json_const_reference_storage)5;
    local_20.float64_.val_ = value;
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
              (&this->result_,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               &local_20.common_);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               &local_20.common_);
    this->is_valid_ = true;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
        semantic_tag tag,   
        const ser_context&,
        std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, value, tag);
                break;
            case structure_type::root_t:
                result_ = Json(value, tag);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }